

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::debugReportRowPrice
          (HighsSparseMatrix *this,HighsInt iRow,double multiplier,HighsInt to_iEl,
          vector<double,_std::allocator<double>_> *result)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  
  if ((this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iRow] < to_iEl) {
    printf("Row %d: value = %11.4g",(ulong)(uint)iRow);
    iVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iRow];
    lVar4 = (long)iVar3;
    if (iVar3 < to_iEl) {
      iVar3 = to_iEl - iVar3;
      iVar5 = 0;
      uVar2 = 0;
      do {
        uVar1 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        dVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4] * multiplier +
                (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)uVar1];
        uVar6 = -(ulong)(ABS(dVar7) < 1e-14);
        if ((int)(uVar2 / 5) * 5 + iVar5 == 0) {
          putchar(10);
        }
        printf("[%4d %11.4g] ",uVar6 & 0x358dee7a4ad4b81f | ~uVar6 & (ulong)dVar7,(ulong)uVar1);
        uVar2 = (ulong)((int)uVar2 + 1);
        lVar4 = lVar4 + 1;
        iVar5 = iVar5 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void HighsSparseMatrix::debugReportRowPrice(
    const HighsInt iRow, const double multiplier, const HighsInt to_iEl,
    const vector<double>& result) const {
  if (this->start_[iRow] >= to_iEl) return;
  printf("Row %d: value = %11.4g", (int)iRow, multiplier);
  HighsInt num_print = 0;
  for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
    HighsInt iCol = this->index_[iEl];
    double value0 = result[iCol];
    double value1 = value0 + multiplier * this->value_[iEl];
    double value2 = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    if (num_print % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)(iCol), value2);
    num_print++;
  }
  printf("\n");
}